

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isSimpleBitVector(Type *this)

{
  Type *pTVar1;
  Type *pTVar2;
  bool bVar3;
  
  pTVar1 = getCanonicalType(this);
  pTVar2 = getCanonicalType(pTVar1);
  bVar3 = true;
  if ((pTVar2->super_Symbol).kind != PredefinedIntegerType) {
    pTVar2 = getCanonicalType(pTVar1);
    if ((pTVar2->super_Symbol).kind != ScalarType) {
      if ((pTVar1->super_Symbol).kind == PackedArrayType) {
        pTVar1 = getCanonicalType((Type *)pTVar1[1].super_Symbol.name._M_len);
        bVar3 = (pTVar1->super_Symbol).kind == ScalarType;
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool Type::isSimpleBitVector() const {
    const Type& ct = getCanonicalType();
    if (ct.isPredefinedInteger() || ct.isScalar())
        return true;

    return ct.kind == SymbolKind::PackedArrayType &&
           ct.as<PackedArrayType>().elementType.isScalar();
}